

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O3

puint32 p_socket_address_get_scope_id(PSocketAddress *addr)

{
  puint32 pVar1;
  
  pVar1 = 0;
  if ((addr != (PSocketAddress *)0x0) && (pVar1 = 0, addr->family == P_SOCKET_FAMILY_INET6)) {
    pVar1 = addr->scope_id;
  }
  return pVar1;
}

Assistant:

P_LIB_API puint32
p_socket_address_get_scope_id (const PSocketAddress *addr)
{
#if !defined (AF_INET6) || !defined (PLIBSYS_SOCKADDR_IN6_HAS_SCOPEID)
	P_UNUSED (addr);
	return 0;
#else
	if (P_UNLIKELY (addr == NULL || addr->family != P_SOCKET_FAMILY_INET6))
		return 0;

	return addr->scope_id;
#endif
}